

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcmarker.c
# Opt level: O2

void write_scan_header(j_compress_ptr cinfo)

{
  jpeg_marker_writer *pjVar1;
  jpeg_component_info *pjVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  int iVar7;
  char ac_in_use [16];
  char dc_in_use [16];
  
  pjVar1 = cinfo->marker;
  if (cinfo->arith_code == 0) {
    for (lVar5 = 0; lVar5 < cinfo->comps_in_scan; lVar5 = lVar5 + 1) {
      pjVar2 = cinfo->cur_comp_info[lVar5];
      if ((cinfo->Ss == 0) && (cinfo->Ah == 0)) {
        emit_dht(cinfo,pjVar2->dc_tbl_no,0);
      }
      if (cinfo->Se != 0) {
        emit_dht(cinfo,pjVar2->ac_tbl_no,1);
      }
    }
  }
  else {
    for (lVar5 = 0; lVar5 != 0x10; lVar5 = lVar5 + 1) {
      ac_in_use[lVar5] = '\0';
      dc_in_use[lVar5] = '\0';
    }
    uVar6 = 0;
    uVar4 = (ulong)(uint)cinfo->comps_in_scan;
    if (cinfo->comps_in_scan < 1) {
      uVar4 = uVar6;
    }
    for (; uVar4 != uVar6; uVar6 = uVar6 + 1) {
      pjVar2 = cinfo->cur_comp_info[uVar6];
      if ((cinfo->Ss == 0) && (cinfo->Ah == 0)) {
        dc_in_use[pjVar2->dc_tbl_no] = '\x01';
      }
      if (cinfo->Se != 0) {
        ac_in_use[pjVar2->ac_tbl_no] = '\x01';
      }
    }
    iVar7 = 0;
    for (lVar5 = 0; lVar5 != 0x10; lVar5 = lVar5 + 1) {
      iVar7 = iVar7 + dc_in_use[lVar5] + (int)ac_in_use[lVar5];
    }
    if (iVar7 != 0) {
      emit_marker(cinfo,M_DAC);
      emit_2bytes(cinfo,iVar7 * 2 + 2);
      for (lVar5 = 0; lVar5 != 0x10; lVar5 = lVar5 + 1) {
        if (dc_in_use[lVar5] != '\0') {
          emit_byte(cinfo,(uint)lVar5);
          emit_byte(cinfo,(uint)cinfo->arith_dc_U[lVar5] * 0x10 + (uint)cinfo->arith_dc_L[lVar5]);
        }
        if (ac_in_use[lVar5] != '\0') {
          emit_byte(cinfo,(uint)lVar5 | 0x10);
          emit_byte(cinfo,(uint)cinfo->arith_ac_K[lVar5]);
        }
      }
    }
  }
  if (cinfo->restart_interval != *(uint *)&pjVar1[1].write_file_header) {
    emit_marker(cinfo,M_DRI);
    emit_2bytes(cinfo,4);
    emit_2bytes(cinfo,cinfo->restart_interval);
    *(uint *)&pjVar1[1].write_file_header = cinfo->restart_interval;
  }
  emit_marker(cinfo,M_SOS);
  emit_2bytes(cinfo,cinfo->comps_in_scan * 2 + 6);
  emit_byte(cinfo,cinfo->comps_in_scan);
  for (lVar5 = 0; lVar5 < cinfo->comps_in_scan; lVar5 = lVar5 + 1) {
    pjVar2 = cinfo->cur_comp_info[lVar5];
    emit_byte(cinfo,pjVar2->component_id);
    iVar7 = 0;
    iVar3 = 0;
    if ((cinfo->Ss == 0) && (cinfo->Ah == 0)) {
      iVar3 = pjVar2->dc_tbl_no << 4;
    }
    if (cinfo->Se != 0) {
      iVar7 = pjVar2->ac_tbl_no;
    }
    emit_byte(cinfo,iVar7 + iVar3);
  }
  emit_byte(cinfo,cinfo->Ss);
  emit_byte(cinfo,cinfo->Se);
  emit_byte(cinfo,cinfo->Ah * 0x10 + cinfo->Al);
  return;
}

Assistant:

METHODDEF(void)
write_scan_header(j_compress_ptr cinfo)
{
  my_marker_ptr marker = (my_marker_ptr)cinfo->marker;
  int i;
  jpeg_component_info *compptr;

  if (cinfo->arith_code) {
    /* Emit arith conditioning info.  We may have some duplication
     * if the file has multiple scans, but it's so small it's hardly
     * worth worrying about.
     */
    emit_dac(cinfo);
  } else {
    /* Emit Huffman tables.
     * Note that emit_dht() suppresses any duplicate tables.
     */
    for (i = 0; i < cinfo->comps_in_scan; i++) {
      compptr = cinfo->cur_comp_info[i];
      /* DC needs no table for refinement scan */
      if (cinfo->Ss == 0 && cinfo->Ah == 0)
        emit_dht(cinfo, compptr->dc_tbl_no, FALSE);
      /* AC needs no table when not present */
      if (cinfo->Se)
        emit_dht(cinfo, compptr->ac_tbl_no, TRUE);
    }
  }

  /* Emit DRI if required --- note that DRI value could change for each scan.
   * We avoid wasting space with unnecessary DRIs, however.
   */
  if (cinfo->restart_interval != marker->last_restart_interval) {
    emit_dri(cinfo);
    marker->last_restart_interval = cinfo->restart_interval;
  }

  emit_sos(cinfo);
}